

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

int kex_method_diffie_hellman_group_exchange_sha256_key_exchange
              (LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  int iVar1;
  BIGNUM *pBVar2;
  undefined1 local_68 [8];
  EVP_MD_CTX *exchange_hash_ctx;
  string_buf buf;
  size_t g_len;
  size_t p_len;
  uchar *g;
  uchar *p;
  int rc;
  int ret;
  key_exchange_state_low_t *key_state_local;
  LIBSSH2_SESSION *session_local;
  
  p._4_4_ = 0;
  _rc = key_state;
  key_state_local = (key_exchange_state_low_t *)session;
  if (key_state->state == libssh2_NB_state_idle) {
    pBVar2 = BN_new();
    _rc->p = (BIGNUM *)pBVar2;
    pBVar2 = BN_new();
    _rc->g = (BIGNUM *)pBVar2;
    _rc->request[0] = '\"';
    _libssh2_htonu32(_rc->request + 1,0x800);
    _libssh2_htonu32(_rc->request + 5,0x1000);
    _libssh2_htonu32(_rc->request + 9,0x2000);
    _rc->request_len = 0xd;
    _rc->state = libssh2_NB_state_created;
  }
  if (_rc->state == libssh2_NB_state_created) {
    p._0_4_ = _libssh2_transport_send
                        ((LIBSSH2_SESSION *)key_state_local,_rc->request,_rc->request_len,
                         (uchar *)0x0,0);
    if ((int)p == -0x25) {
      return -0x25;
    }
    if ((int)p != 0) {
      p._4_4_ = _libssh2_error((LIBSSH2_SESSION *)key_state_local,(int)p,
                               "Unable to send Group Exchange Request SHA256");
      goto LAB_0012170f;
    }
    _rc->state = libssh2_NB_state_sent;
  }
  if (_rc->state == libssh2_NB_state_sent) {
    p._0_4_ = _libssh2_packet_require
                        ((LIBSSH2_SESSION *)key_state_local,'\x1f',&_rc->data,&_rc->data_len,0,
                         (uchar *)0x0,0,&_rc->req_state);
    if ((int)p == -0x25) {
      return -0x25;
    }
    if ((int)p != 0) {
      p._4_4_ = _libssh2_error((LIBSSH2_SESSION *)key_state_local,(int)p,
                               "Timeout waiting for GEX_GROUP reply SHA256");
      goto LAB_0012170f;
    }
    _rc->state = libssh2_NB_state_sent1;
  }
  if (_rc->state == libssh2_NB_state_sent1) {
    if (_rc->data_len < 9) {
      p._4_4_ = _libssh2_error((LIBSSH2_SESSION *)key_state_local,-0xe,
                               "Unexpected key length DH-SHA256");
    }
    else {
      exchange_hash_ctx = (EVP_MD_CTX *)_rc->data;
      buf.dataptr = (uchar *)_rc->data_len;
      buf.data = (uchar *)(exchange_hash_ctx + 1);
      iVar1 = _libssh2_get_bignum_bytes((string_buf *)&exchange_hash_ctx,&g,&g_len);
      if (iVar1 == 0) {
        iVar1 = _libssh2_get_bignum_bytes
                          ((string_buf *)&exchange_hash_ctx,(uchar **)&p_len,&buf.len);
        if (iVar1 == 0) {
          BN_bin2bn(g,(int)g_len,(BIGNUM *)_rc->p);
          BN_bin2bn((uchar *)p_len,(int)buf.len,(BIGNUM *)_rc->g);
          p._4_4_ = diffie_hellman_sha_algo
                              ((LIBSSH2_SESSION *)key_state_local,_rc->g,_rc->p,(int)g_len,0x100,
                               local_68,' ','!',_rc->data + 1,_rc->data_len - 1,&_rc->exchange_state
                              );
          if (p._4_4_ == -0x25) {
            return -0x25;
          }
          (**(code **)&key_state_local->exchange_state)(_rc->data,key_state_local);
        }
        else {
          p._4_4_ = _libssh2_error((LIBSSH2_SESSION *)key_state_local,-0xe,
                                   "Unexpected value DH-SHA256 g");
        }
      }
      else {
        p._4_4_ = _libssh2_error((LIBSSH2_SESSION *)key_state_local,-0xe,
                                 "Unexpected value DH-SHA256 p");
      }
    }
  }
LAB_0012170f:
  _rc->state = libssh2_NB_state_idle;
  BN_clear_free((BIGNUM *)_rc->g);
  _rc->g = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)_rc->p);
  _rc->p = (BIGNUM *)0x0;
  return p._4_4_;
}

Assistant:

static int
kex_method_diffie_hellman_group_exchange_sha256_key_exchange(
                                          LIBSSH2_SESSION * session,
                                          key_exchange_state_low_t * key_state)
{
    int ret = 0;
    int rc;

    if(key_state->state == libssh2_NB_state_idle) {
        key_state->p = _libssh2_bn_init();
        key_state->g = _libssh2_bn_init();
        /* Ask for a P and G pair */
        key_state->request[0] = SSH_MSG_KEX_DH_GEX_REQUEST;
        _libssh2_htonu32(key_state->request + 1, LIBSSH2_DH_GEX_MINGROUP);
        _libssh2_htonu32(key_state->request + 5, LIBSSH2_DH_GEX_OPTGROUP);
        _libssh2_htonu32(key_state->request + 9, LIBSSH2_DH_GEX_MAXGROUP);
        key_state->request_len = 13;
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Initiating Diffie-Hellman Group-Exchange SHA256"));

        key_state->state = libssh2_NB_state_created;
    }

    if(key_state->state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, key_state->request,
                                     key_state->request_len, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send "
                                 "Group Exchange Request SHA256");
            goto dh_gex_clean_exit;
        }

        key_state->state = libssh2_NB_state_sent;
    }

    if(key_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_packet_require(session, SSH_MSG_KEX_DH_GEX_GROUP,
                                     &key_state->data, &key_state->data_len,
                                     0, NULL, 0, &key_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timeout waiting for GEX_GROUP reply SHA256");
            goto dh_gex_clean_exit;
        }

        key_state->state = libssh2_NB_state_sent1;
    }

    if(key_state->state == libssh2_NB_state_sent1) {
        unsigned char *p, *g;
        size_t p_len, g_len;
        struct string_buf buf;
        libssh2_sha256_ctx exchange_hash_ctx;

        if(key_state->data_len < 9) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected key length DH-SHA256");
            goto dh_gex_clean_exit;
        }

        buf.data = key_state->data;
        buf.dataptr = buf.data;
        buf.len = key_state->data_len;

        buf.dataptr++; /* increment to big num */

        if(_libssh2_get_bignum_bytes(&buf, &p, &p_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected value DH-SHA256 p");
            goto dh_gex_clean_exit;
        }

        if(_libssh2_get_bignum_bytes(&buf, &g, &g_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected value DH-SHA256 g");
            goto dh_gex_clean_exit;
        }

        _libssh2_bn_from_bin(key_state->p, p_len, p);
        _libssh2_bn_from_bin(key_state->g, g_len, g);

        ret = diffie_hellman_sha_algo(session, key_state->g, key_state->p,
                                      (int)p_len, 256,
                                      (void *)&exchange_hash_ctx,
                                      SSH_MSG_KEX_DH_GEX_INIT,
                                      SSH_MSG_KEX_DH_GEX_REPLY,
                                      key_state->data + 1,
                                      key_state->data_len - 1,
                                      &key_state->exchange_state);
        if(ret == LIBSSH2_ERROR_EAGAIN) {
            return ret;
        }

        LIBSSH2_FREE(session, key_state->data);
    }

dh_gex_clean_exit:
    key_state->state = libssh2_NB_state_idle;
    _libssh2_bn_free(key_state->g);
    key_state->g = NULL;
    _libssh2_bn_free(key_state->p);
    key_state->p = NULL;

    return ret;
}